

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O1

void __thiscall AllDiffBoundsImp<4>::sortit(AllDiffBoundsImp<4> *this)

{
  int *piVar1;
  IntView<4> *pIVar2;
  interval *piVar3;
  int *piVar4;
  int *piVar5;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int *piVar15;
  
  iVar13 = this->sz;
  if (0 < (long)iVar13) {
    piVar1 = this->minsorted;
    pIVar2 = this->x;
    piVar3 = this->iv;
    uVar10 = (ulong)(iVar13 - 1);
    uVar7 = (long)iVar13;
    do {
      iVar13 = piVar1[uVar7 - 1];
      piVar3[iVar13].min = pIVar2[iVar13].b + ((pIVar2[iVar13].var)->min).v;
      uVar14 = uVar7 - 1;
      if ((long)uVar7 < (long)this->sz) {
        uVar14 = uVar10;
        do {
          if (piVar3[iVar13].min < piVar3[piVar1[uVar14 + 1]].min) break;
          piVar1[uVar14] = piVar1[uVar14 + 1];
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < this->sz + -1);
      }
      piVar1[uVar14 & 0xffffffff] = iVar13;
      uVar10 = uVar10 - 1;
      bVar6 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar6);
  }
  iVar13 = this->sz;
  if (0 < (long)iVar13) {
    piVar1 = this->maxsorted;
    pIVar2 = this->x;
    piVar3 = this->iv;
    uVar10 = (ulong)(iVar13 - 1);
    uVar7 = (long)iVar13;
    do {
      iVar13 = piVar1[uVar7 - 1];
      piVar3[iVar13].max = pIVar2[iVar13].b + ((pIVar2[iVar13].var)->max).v + 1;
      uVar14 = uVar7 - 1;
      if ((long)uVar7 < (long)this->sz) {
        uVar14 = uVar10;
        do {
          if (piVar3[iVar13].max < piVar3[piVar1[uVar14 + 1]].max) break;
          piVar1[uVar14] = piVar1[uVar14 + 1];
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < this->sz + -1);
      }
      piVar1[uVar14 & 0xffffffff] = iVar13;
      uVar10 = uVar10 - 1;
      bVar6 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar6);
  }
  piVar3 = this->iv;
  piVar1 = this->minsorted;
  iVar9 = piVar3[*piVar1].min;
  piVar4 = this->maxsorted;
  iVar8 = piVar3[*piVar4].max;
  iVar13 = iVar9 + -2;
  piVar5 = this->bounds;
  *piVar5 = iVar13;
  this->nb = 0;
  iVar11 = 0;
  iVar12 = 0;
LAB_00158616:
  do {
    piVar15 = piVar1 + iVar12;
    do {
      if ((this->sz <= iVar12) || (iVar8 < iVar9)) {
        if (iVar8 != iVar13) {
          iVar13 = this->nb;
          this->nb = iVar13 + 1;
          piVar5[(long)iVar13 + 1] = iVar8;
          iVar13 = iVar8;
        }
        iVar8 = this->nb;
        piVar3[piVar4[iVar11]].maxrank = iVar8;
        iVar11 = iVar11 + 1;
        if (iVar11 == this->sz) {
          piVar5[(long)iVar8 + 1] = piVar5[iVar8] + 2;
          return;
        }
        iVar8 = piVar3[piVar4[iVar11]].max;
        goto LAB_00158616;
      }
      if (iVar9 != iVar13) {
        iVar13 = this->nb;
        this->nb = iVar13 + 1;
        piVar5[(long)iVar13 + 1] = iVar9;
        iVar13 = iVar9;
      }
      piVar3[*piVar15].minrank = this->nb;
      iVar12 = iVar12 + 1;
      piVar15 = piVar15 + 1;
    } while (this->sz <= iVar12);
    iVar9 = piVar3[piVar1[iVar12]].min;
  } while( true );
}

Assistant:

void sortit() {
		int i;
		int j;
		int min;
		int max;
		int last;

		for (int i = sz - 1; i >= 0; --i) {
			const int t = minsorted[i];
			iv[t].min = static_cast<int>(x[t].getMin());
			int j;
			for (j = i; j < sz - 1; ++j) {
				if (iv[t].min < iv[minsorted[j + 1]].min) {
					break;
				}
				minsorted[j] = minsorted[j + 1];
			}
			minsorted[j] = t;
		}
		for (int i = sz - 1; i >= 0; --i) {
			const int t = maxsorted[i];
			iv[t].max = static_cast<int>(x[t].getMax()) + 1;
			int j;
			for (j = i; j < sz - 1; ++j) {
				if (iv[t].max < iv[maxsorted[j + 1]].max) {
					break;
				}
				maxsorted[j] = maxsorted[j + 1];
			}
			maxsorted[j] = t;
		}

		min = iv[minsorted[0]].min;
		max = iv[maxsorted[0]].max;
		bounds[0] = last = min - 2;

		for (i = j = nb = 0;;) {       // merge minsorted[] and maxsorted[] into bounds[]
			if (i < sz && min <= max) {  // make sure minsorted exhausted first
				if (min != last) {
					bounds[++nb] = last = min;
				}
				iv[minsorted[i]].minrank = nb;
				if (++i < sz) {
					min = iv[minsorted[i]].min;
				}
			} else {
				if (max != last) {
					bounds[++nb] = last = max;
				}
				iv[maxsorted[j]].maxrank = nb;
				if (++j == sz) {
					break;
				}
				max = iv[maxsorted[j]].max;
			}
		}
		bounds[nb + 1] = bounds[nb] + 2;
	}